

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>_>_> *fadexpr)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *pFVar6;
  Fad<double> *pFVar7;
  Fad<double> *pFVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  double *pdVar13;
  double *pdVar14;
  
  pFVar6 = (fadexpr->fadexpr_).expr_;
  uVar2 = (((pFVar6->fadexpr_).left_)->dx_).num_elts;
  uVar3 = (((pFVar6->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar10 = (ulong)uVar3;
  uVar2 = (this->dx_).num_elts;
  if (uVar3 != uVar2) {
    if (uVar3 == 0) {
      if (uVar2 != 0) {
        pdVar9 = (this->dx_).ptr_to_data;
        if (pdVar9 != (double *)0x0) {
          operator_delete__(pdVar9);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar2 != 0) {
        pdVar9 = (this->dx_).ptr_to_data;
        if (pdVar9 != (double *)0x0) {
          operator_delete__(pdVar9);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar3;
      uVar11 = 0xffffffffffffffff;
      if (-1 < (int)uVar3) {
        uVar11 = (long)(int)uVar3 << 3;
      }
      pdVar9 = (double *)operator_new__(uVar11);
      (this->dx_).ptr_to_data = pdVar9;
    }
  }
  if (uVar3 != 0) {
    pdVar9 = (this->dx_).ptr_to_data;
    pFVar6 = (fadexpr->fadexpr_).expr_;
    pFVar7 = (pFVar6->fadexpr_).left_;
    iVar4 = (pFVar7->dx_).num_elts;
    if ((iVar4 == 0) || ((((pFVar6->fadexpr_).right_)->dx_).num_elts == 0)) {
      if (0 < (int)uVar3) {
        pFVar8 = (pFVar6->fadexpr_).right_;
        iVar5 = (pFVar8->dx_).num_elts;
        lVar12 = 0;
        do {
          pdVar14 = (double *)((long)(pFVar7->dx_).ptr_to_data + lVar12);
          if (iVar4 == 0) {
            pdVar14 = &pFVar7->defaultVal;
          }
          dVar1 = pFVar8->val_;
          pdVar13 = (double *)((long)(pFVar8->dx_).ptr_to_data + lVar12);
          if (iVar5 == 0) {
            pdVar13 = &pFVar8->defaultVal;
          }
          *(double *)((long)pdVar9 + lVar12) =
               -(*pdVar14 * dVar1 - pFVar7->val_ * *pdVar13) / (dVar1 * dVar1);
          lVar12 = lVar12 + 8;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
    }
    else if (0 < (int)uVar3) {
      pdVar14 = (pFVar7->dx_).ptr_to_data;
      pFVar8 = (pFVar6->fadexpr_).right_;
      pdVar13 = (pFVar8->dx_).ptr_to_data;
      uVar11 = 0;
      do {
        dVar1 = pFVar8->val_;
        pdVar9[uVar11] =
             -(pdVar14[uVar11] * dVar1 - pFVar7->val_ * pdVar13[uVar11]) / (dVar1 * dVar1);
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
  }
  pFVar6 = (fadexpr->fadexpr_).expr_;
  this->val_ = -((pFVar6->fadexpr_).left_)->val_ / ((pFVar6->fadexpr_).right_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}